

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<5UL> mserialize::cx_strcat<5ul>(cx_string<5UL> *strings)

{
  char *pcVar1;
  bool bVar2;
  size_t s;
  long lVar3;
  char buffer [6];
  char local_18 [8];
  undefined8 local_10;
  
  pcVar1 = local_18;
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  bVar2 = true;
  while (bVar2) {
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      pcVar1[lVar3] = strings->_data[lVar3];
    }
    pcVar1 = pcVar1 + 5;
    bVar2 = false;
  }
  cx_string<5UL>::cx_string((cx_string<5UL> *)&local_10,local_18);
  return (char  [6])((uint6)local_10._4_4_ << 0x20 | (uint6)(uint)local_10);
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}